

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O0

int64_t duckdb::DatePart::ISOYearOperator::Operation<duckdb::dtime_t,long>(dtime_t input)

{
  NotImplementedException *this;
  allocator local_29;
  string local_28 [40];
  
  this = (NotImplementedException *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"\"time\" units \"isoyear\" not recognized",&local_29);
  duckdb::NotImplementedException::NotImplementedException(this,local_28);
  __cxa_throw(this,&NotImplementedException::typeinfo,
              NotImplementedException::~NotImplementedException);
}

Assistant:

int64_t DatePart::ISOYearOperator::Operation(dtime_t input) {
	throw NotImplementedException("\"time\" units \"isoyear\" not recognized");
}